

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorbase.h
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::operator*(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *__return_storage_ptr__,
           VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *vec)

{
  cpp_dec_float<50U,_int,_void> *pcVar1;
  pointer pnVar2;
  pointer pnVar3;
  undefined8 uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  cpp_dec_float<50U,_int,_void> *v;
  long lVar8;
  fpclass_type fVar9;
  int32_t iVar10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_68.fpclass = cpp_dec_float_finite;
  local_68.prec_elem = 10;
  local_68.data._M_elems[0] = 0;
  local_68.data._M_elems[1] = 0;
  local_68.data._M_elems[2] = 0;
  local_68.data._M_elems[3] = 0;
  local_68.data._M_elems[4] = 0;
  local_68.data._M_elems[5] = 0;
  local_68.data._M_elems._24_5_ = 0;
  local_68.data._M_elems[7]._1_3_ = 0;
  local_68.data._M_elems._32_5_ = 0;
  local_68.data._M_elems[9]._1_3_ = 0;
  local_68.exp = 0;
  local_68.neg = false;
  uVar5 = (int)((long)(this->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x49249249;
  if ((int)uVar5 < 1) {
    fVar9 = cpp_dec_float_finite;
    iVar10 = 10;
    local_68.neg = false;
    local_68.exp = 0;
  }
  else {
    uVar6 = (ulong)(uVar5 & 0x7fffffff);
    lVar7 = 0;
    lVar8 = 0;
    do {
      pnVar2 = (this->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar1 = (cpp_dec_float<50U,_int,_void> *)((long)&(pnVar2->m_backend).data + lVar7);
      pnVar3 = (vec->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_a8.fpclass = cpp_dec_float_finite;
      local_a8.prec_elem = 10;
      local_a8.data._M_elems[0] = 0;
      local_a8.data._M_elems[1] = 0;
      local_a8.data._M_elems[2] = 0;
      local_a8.data._M_elems[3] = 0;
      local_a8.data._M_elems[4] = 0;
      local_a8.data._M_elems[5] = 0;
      local_a8.data._M_elems._24_5_ = 0;
      local_a8.data._M_elems[7]._1_3_ = 0;
      local_a8.data._M_elems._32_5_ = 0;
      local_a8.data._M_elems[9]._1_3_ = 0;
      local_a8.exp = 0;
      local_a8.neg = false;
      v = pcVar1;
      if (((cpp_dec_float<50U,_int,_void> *)((long)&(pnVar3->m_backend).data + lVar7) != &local_a8)
         && (v = &pnVar3[lVar8].m_backend, pcVar1 != &local_a8)) {
        uVar4 = *(undefined8 *)((pcVar1->data)._M_elems + 8);
        local_a8.data._M_elems._32_5_ = SUB85(uVar4,0);
        local_a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_a8.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
        local_a8.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
        local_a8.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
        uVar4 = *(undefined8 *)((pcVar1->data)._M_elems + 6);
        local_a8.data._M_elems._24_5_ = SUB85(uVar4,0);
        local_a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_a8.exp = *(int *)((long)&(pnVar2->m_backend).data + lVar7 + 0x28);
        local_a8.neg = *(bool *)((long)&(pnVar2->m_backend).data + lVar7 + 0x2c);
        local_a8._48_8_ = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar7 + 0x30);
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_a8,v);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&local_68,&local_a8);
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x38;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
    fVar9 = local_68.fpclass;
    iVar10 = local_68.prec_elem;
  }
  *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
       CONCAT35(local_68.data._M_elems[9]._1_3_,local_68.data._M_elems._32_5_);
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
       local_68.data._M_elems._16_8_;
  *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
       CONCAT35(local_68.data._M_elems[7]._1_3_,local_68.data._M_elems._24_5_);
  *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems = local_68.data._M_elems._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
       local_68.data._M_elems._8_8_;
  (__return_storage_ptr__->m_backend).exp = local_68.exp;
  (__return_storage_ptr__->m_backend).neg = local_68.neg;
  (__return_storage_ptr__->m_backend).fpclass = fVar9;
  (__return_storage_ptr__->m_backend).prec_elem = iVar10;
  return __return_storage_ptr__;
}

Assistant:

R operator*(const VectorBase<R>& vec) const
   {
      StableSum<R> x;

      auto dimen = dim();

      for(decltype(dimen) i = 0; i < dimen; i++)
         x += val[i] * vec.val[i];

      return x;
   }